

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildReg3B1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot src1RegSlot,
          RegSlot src2RegSlot,uint8 index)

{
  code *pcVar1;
  bool bVar2;
  uint offset_00;
  undefined4 *puVar3;
  RegOpnd *srcOpnd;
  RegOpnd *pRVar4;
  RegOpnd *pRVar5;
  IntConstOpnd *src1Opnd;
  IndirOpnd *dstOpnd;
  IndirOpnd *dstOpnd_00;
  ByteCodeUsesInstr *this_00;
  Instr *pIVar6;
  Instr *local_48;
  
  offset_00 = (uint)index;
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xa1c,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_004931a3;
    *puVar3 = 0;
  }
  srcOpnd = BuildSrcOpnd(this,src1RegSlot,TyVar);
  pRVar4 = BuildSrcOpnd(this,src2RegSlot,TyVar);
  if (newOpcode == MaxByteSizedOpcodes) {
    pRVar5 = BuildDstOpnd(this,dstRegSlot,TyVar,false,true);
  }
  else {
    if (newOpcode == NewConcatStrMulti) {
      pRVar5 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
      src1Opnd = IR::IntConstOpnd::New((ulong)index,TyUint32,this->m_func,false);
      local_48 = IR::Instr::New(NewConcatStrMulti,&pRVar5->super_Opnd,&src1Opnd->super_Opnd,
                                this->m_func);
      offset_00 = 0;
      goto LAB_00493087;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xa2f,"(false)","false");
    if (!bVar2) {
LAB_004931a3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pRVar5 = (RegOpnd *)0x0;
  }
  local_48 = (Instr *)0x0;
LAB_00493087:
  IR::Opnd::SetValueType(&pRVar5->super_Opnd,(ValueType)0x800);
  dstOpnd = IR::IndirOpnd::New(pRVar5,offset_00,TyVar,this->m_func,false);
  dstOpnd_00 = IR::IndirOpnd::New(pRVar5,offset_00 + 1,TyVar,this->m_func,false);
  pRVar5 = InsertConvPrimStr(this,srcOpnd,offset,true);
  pRVar4 = InsertConvPrimStr(this,pRVar4,0xffffffff,true);
  if ((srcOpnd->m_sym->field_0x19 & 0x20) != 0) {
    this_00 = IR::ByteCodeUsesInstr::New(this->m_func,0xffffffff);
    IR::ByteCodeUsesInstr::Set(this_00,&srcOpnd->super_Opnd);
    AddInstr(this,&this_00->super_Instr,0xffffffff);
  }
  if (local_48 != (Instr *)0x0) {
    AddInstr(this,local_48,0xffffffff);
  }
  pIVar6 = IR::Instr::New(SetConcatStrMultiItem,&dstOpnd->super_Opnd,&pRVar5->super_Opnd,
                          this->m_func);
  AddInstr(this,pIVar6,0xffffffff);
  pIVar6 = IR::Instr::New(SetConcatStrMultiItem,&dstOpnd_00->super_Opnd,&pRVar4->super_Opnd,
                          this->m_func);
  AddInstr(this,pIVar6,0xffffffff);
  return;
}

Assistant:

void
IRBuilder::BuildReg3B1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot,
                    Js::RegSlot src2RegSlot, uint8 index)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr *     instr;
    IR::RegOpnd * src1Opnd = this->BuildSrcOpnd(src1RegSlot);
    IR::RegOpnd * src2Opnd = this->BuildSrcOpnd(src2RegSlot);
    IR::RegOpnd * dstOpnd = nullptr;

    IR::Instr * newConcatStrMulti = nullptr;
    switch (newOpcode)
    {
    case Js::OpCode::NewConcatStrMulti:
        dstOpnd = this->BuildDstOpnd(dstRegSlot);
        newConcatStrMulti = IR::Instr::New(Js::OpCode::NewConcatStrMulti, dstOpnd, IR::IntConstOpnd::New(index, TyUint32, m_func), m_func);
        index = 0;
        break;
    case Js::OpCode::SetConcatStrMultiItem2:
        dstOpnd = this->BuildDstOpnd(dstRegSlot, TyVar, false, true);
        break;
    default:
        Assert(false);
    };
    dstOpnd->SetValueType(ValueType::String);
    IR::IndirOpnd * indir1Opnd = IR::IndirOpnd::New(dstOpnd, index, TyVar, m_func);
    IR::IndirOpnd * indir2Opnd = IR::IndirOpnd::New(dstOpnd, index + 1, TyVar, m_func);

    // Need to do the to str first, as they may have side effects.
    IR::RegOpnd * str1Opnd = InsertConvPrimStr(src1Opnd, offset, true);
    IR::RegOpnd * str2Opnd = InsertConvPrimStr(src2Opnd, Js::Constants::NoByteCodeOffset, true);

    // Need to insert a byte code use for src1 so that if ConvPrimStr of the src2 bail out
    // we will restore it.
    if (src1Opnd->m_sym->HasByteCodeRegSlot())
    {
        IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, Js::Constants::NoByteCodeOffset);
        byteCodeUse->Set(src1Opnd);
        this->AddInstr(byteCodeUse, Js::Constants::NoByteCodeOffset);
    }

    if (newConcatStrMulti)
    {
        // Allocate the concat str after the ConvToStr
        this->AddInstr(newConcatStrMulti, Js::Constants::NoByteCodeOffset);
    }
    instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, indir1Opnd, str1Opnd, m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, indir2Opnd, str2Opnd, m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
}